

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 extraout_EAX;
  int iVar8;
  int iVar9;
  parasail_result_t *result;
  __m128i *palVar10;
  __m128i *palVar11;
  __m128i *b;
  bool bVar12;
  uint uVar13;
  char *pcVar15;
  undefined8 extraout_RDX;
  ulong uVar16;
  ulong uVar17;
  char *__format;
  undefined8 in_R9;
  __m128i *palVar18;
  long lVar19;
  __m128i *palVar20;
  ulong uVar21;
  ulong size;
  uint uVar22;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar29;
  int iVar30;
  uint uVar31;
  int iVar33;
  uint uVar34;
  int iVar35;
  undefined1 auVar32 [16];
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  __m128i c;
  __m128i c_00;
  __m128i vH;
  __m128i vH_00;
  uint local_11c;
  ulong local_108;
  __m128i *local_100;
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  ulong uVar14;
  size_t len;
  longlong extraout_RDX_00;
  
  uVar16 = (ulong)(uint)s2Len;
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile32.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "open";
        }
        else {
          if (-1 < gap) {
            uVar13 = 0x7ffffffe - ppVar5->max;
            uVar14 = (ulong)uVar13;
            result = parasail_result_new_table1((uint)((ulong)uVar3 + 3) & 0x7ffffffc,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = (ulong)uVar3 + 3 >> 2;
              result->flag = result->flag | 0x4420804;
              palVar10 = parasail_memalign___m128i(0x10,size);
              palVar11 = parasail_memalign___m128i(0x10,size);
              local_100 = parasail_memalign___m128i(0x10,size);
              b = parasail_memalign___m128i(0x10,size);
              bVar12 = palVar11 == (__m128i *)0x0 || palVar10 == (__m128i *)0x0;
              len = CONCAT71((int7)(uVar14 >> 8),bVar12);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              local_108 = 0;
              c[1]._0_1_ = (b == (__m128i *)0x0 || local_100 == (__m128i *)0x0) || bVar12;
              if ((b != (__m128i *)0x0 && local_100 != (__m128i *)0x0) &&
                  (palVar11 != (__m128i *)0x0 && palVar10 != (__m128i *)0x0)) {
                c[0] = size;
                parasail_memset___m128i(palVar10,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b,c_00,len);
                uVar6 = (uint)size;
                uVar14 = uVar16 & 0xffffffff;
                uVar31 = 0xc0000000;
                uVar34 = 0xc0000000;
                uVar27 = 0xc0000000;
                uVar29 = 0xc0000000;
                local_f8 = 0xc0000000;
                uStack_f4 = 0xc0000000;
                uStack_f0 = 0xc0000000;
                uStack_ec = 0xc0000000;
                local_11c = 0xc0000000;
                uVar21 = 0;
                do {
                  palVar18 = palVar10;
                  if (uVar21 == uVar14) {
LAB_006699f6:
                    iVar8 = (int)uVar16;
                    if (local_11c == 0x7fffffff) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar9 = parasail_result_is_saturated(result);
                    palVar10 = local_100;
                    if (iVar9 == 0) {
                      if ((int)local_108 == iVar8 + -2) {
                        palVar10 = palVar11;
                      }
                      if ((int)local_108 == iVar8 + -1) {
                        palVar10 = palVar18;
                        palVar18 = local_100;
                      }
                      iVar9 = uVar3 - 1;
                      for (uVar16 = 0; (uVar6 & 0x1fffffff) << 2 != (uint)uVar16;
                          uVar16 = uVar16 + 1) {
                        if ((*(uint *)((long)*palVar10 + uVar16 * 4) == local_11c) &&
                           (iVar39 = ((uint)uVar16 & 3) * uVar6 + ((uint)(uVar16 >> 2) & 0x3fffffff)
                           , iVar39 < iVar9)) {
                          iVar9 = iVar39;
                        }
                      }
                      if ((int)local_108 != iVar8 + -2) {
                        local_100 = palVar11;
                      }
                      if ((int)local_108 != iVar8 + -1) {
                        palVar11 = local_100;
                      }
                    }
                    else {
                      local_108._0_4_ = 0;
                      local_11c = 0x7fffffff;
                      iVar9 = 0;
                    }
                    result->score = local_11c;
                    result->end_query = iVar9;
                    result->end_ref = (int)local_108;
                    parasail_free(b);
                    parasail_free(palVar10);
                    parasail_free(palVar11);
                    parasail_free(palVar18);
                    return result;
                  }
                  palVar18 = palVar10 + (uVar6 - 1);
                  iVar39 = (int)(*palVar18)[0];
                  iVar41 = *(int *)((long)*palVar18 + 4);
                  iVar43 = (int)(*palVar18)[1];
                  iVar8 = ppVar5->mapper[(byte)s2[uVar21]];
                  iVar9 = (int)uVar21;
                  palVar18 = palVar11;
                  if ((int)local_108 == iVar9 + -2) {
                    palVar18 = local_100;
                  }
                  iVar37 = 0;
                  auVar32 = (undefined1  [16])0x0;
                  lVar19 = 0;
                  for (uVar17 = 0; size != uVar17; uVar17 = uVar17 + 1) {
                    piVar1 = (int *)((long)pvVar4 + lVar19 + (long)(int)(iVar8 * uVar6) * 0x10);
                    iVar37 = iVar37 + *piVar1;
                    iVar39 = iVar39 + piVar1[1];
                    iVar41 = iVar41 + piVar1[2];
                    iVar43 = iVar43 + piVar1[3];
                    piVar1 = (int *)((long)*b + lVar19);
                    iVar38 = *piVar1;
                    iVar40 = piVar1[1];
                    iVar42 = piVar1[2];
                    iVar44 = piVar1[3];
                    iVar30 = auVar32._0_4_;
                    uVar22 = (uint)(iVar38 < iVar30) * iVar30 | (uint)(iVar38 >= iVar30) * iVar38;
                    iVar33 = auVar32._4_4_;
                    uVar25 = (uint)(iVar40 < iVar33) * iVar33 | (uint)(iVar40 >= iVar33) * iVar40;
                    iVar35 = auVar32._8_4_;
                    uVar26 = (uint)(iVar42 < iVar35) * iVar35 | (uint)(iVar42 >= iVar35) * iVar42;
                    iVar36 = auVar32._12_4_;
                    uVar28 = (uint)(iVar44 < iVar36) * iVar36 | (uint)(iVar44 >= iVar36) * iVar44;
                    uVar22 = (uint)((int)uVar22 < iVar37) * iVar37 |
                             ((int)uVar22 >= iVar37) * uVar22;
                    uVar25 = (uint)((int)uVar25 < iVar39) * iVar39 |
                             ((int)uVar25 >= iVar39) * uVar25;
                    uVar26 = (uint)((int)uVar26 < iVar41) * iVar41 |
                             ((int)uVar26 >= iVar41) * uVar26;
                    uVar28 = (uint)((int)uVar28 < iVar43) * iVar43 |
                             ((int)uVar28 >= iVar43) * uVar28;
                    iVar41 = (-1 < (int)uVar22) * uVar22;
                    iVar39 = (-1 < (int)uVar25) * uVar25;
                    iVar37 = (-1 < (int)uVar26) * uVar26;
                    iVar43 = (-1 < (int)uVar28) * uVar28;
                    piVar1 = (int *)((long)*palVar18 + lVar19);
                    *piVar1 = iVar41;
                    piVar1[1] = iVar39;
                    piVar1[2] = iVar37;
                    piVar1[3] = iVar43;
                    vH[0] = uVar17 & 0xffffffff;
                    vH[1] = size;
                    arr_store_si128(((result->field_4).rowcols)->score_row,vH,iVar9,(int32_t)uVar16,
                                    (int32_t)in_R9,(int32_t)uVar16);
                    local_f8 = (uint)((int)local_f8 < iVar41) * iVar41 |
                               ((int)local_f8 >= iVar41) * local_f8;
                    uStack_f4 = (uint)((int)uStack_f4 < iVar39) * iVar39 |
                                ((int)uStack_f4 >= iVar39) * uStack_f4;
                    uStack_f0 = (uint)((int)uStack_f0 < iVar37) * iVar37 |
                                ((int)uStack_f0 >= iVar37) * uStack_f0;
                    uStack_ec = (uint)((int)uStack_ec < iVar43) * iVar43 |
                                ((int)uStack_ec >= iVar43) * uStack_ec;
                    iVar41 = iVar41 - open;
                    iVar39 = iVar39 - open;
                    iVar37 = iVar37 - open;
                    iVar43 = iVar43 - open;
                    iVar38 = iVar38 - gap;
                    iVar40 = iVar40 - gap;
                    iVar42 = iVar42 - gap;
                    iVar44 = iVar44 - gap;
                    puVar2 = (uint *)((long)*b + lVar19);
                    *puVar2 = (uint)(iVar38 < iVar41) * iVar41 | (uint)(iVar38 >= iVar41) * iVar38;
                    puVar2[1] = (uint)(iVar40 < iVar39) * iVar39 | (uint)(iVar40 >= iVar39) * iVar40
                    ;
                    puVar2[2] = (uint)(iVar42 < iVar37) * iVar37 | (uint)(iVar42 >= iVar37) * iVar42
                    ;
                    puVar2[3] = (uint)(iVar44 < iVar43) * iVar43 | (uint)(iVar44 >= iVar43) * iVar44
                    ;
                    iVar30 = iVar30 - gap;
                    iVar33 = iVar33 - gap;
                    iVar35 = iVar35 - gap;
                    iVar36 = iVar36 - gap;
                    auVar32._0_4_ =
                         (uint)(iVar30 < iVar41) * iVar41 | (uint)(iVar30 >= iVar41) * iVar30;
                    auVar32._4_4_ =
                         (uint)(iVar33 < iVar39) * iVar39 | (uint)(iVar33 >= iVar39) * iVar33;
                    auVar32._8_4_ =
                         (uint)(iVar35 < iVar37) * iVar37 | (uint)(iVar35 >= iVar37) * iVar35;
                    auVar32._12_4_ =
                         (uint)(iVar36 < iVar43) * iVar43 | (uint)(iVar36 >= iVar43) * iVar36;
                    piVar1 = (int *)((long)*palVar10 + lVar19);
                    iVar37 = *piVar1;
                    iVar39 = piVar1[1];
                    iVar41 = piVar1[2];
                    iVar43 = piVar1[3];
                    lVar19 = lVar19 + 0x10;
                  }
                  if ((int)local_108 == iVar9 + -2) {
                    local_100 = palVar11;
                  }
                  palVar11 = local_100;
                  for (iVar8 = 0; uVar7 = SUB84(palVar11,0), iVar8 != 4; iVar8 = iVar8 + 1) {
                    lVar19 = auVar32._8_8_;
                    uVar17 = auVar32._0_8_;
                    auVar32._0_8_ = uVar17 << 0x20;
                    auVar32._8_8_ = lVar19 << 0x20 | uVar17 >> 0x20;
                    palVar20 = palVar18;
                    for (uVar17 = 0; size != uVar17; uVar17 = uVar17 + 1) {
                      iVar41 = (int)(*palVar20)[0];
                      iVar43 = *(int *)((long)*palVar20 + 4);
                      iVar37 = (int)(*palVar20)[1];
                      iVar30 = *(int *)((long)*palVar20 + 0xc);
                      iVar39 = auVar32._0_4_;
                      uVar22 = (uint)(iVar41 < iVar39) * iVar39 | (uint)(iVar41 >= iVar39) * iVar41;
                      iVar41 = auVar32._4_4_;
                      uVar25 = (uint)(iVar43 < iVar41) * iVar41 | (uint)(iVar43 >= iVar41) * iVar43;
                      iVar43 = auVar32._8_4_;
                      uVar26 = (uint)(iVar37 < iVar43) * iVar43 | (uint)(iVar37 >= iVar43) * iVar37;
                      iVar37 = auVar32._12_4_;
                      uVar28 = (uint)(iVar30 < iVar37) * iVar37 | (uint)(iVar30 >= iVar37) * iVar30;
                      *(uint *)*palVar20 = uVar22;
                      *(uint *)((long)*palVar20 + 4) = uVar25;
                      *(uint *)(*palVar20 + 1) = uVar26;
                      *(uint *)((long)*palVar20 + 0xc) = uVar28;
                      vH_00[0] = uVar17 & 0xffffffff;
                      vH_00[1] = size;
                      arr_store_si128(((result->field_4).rowcols)->score_row,vH_00,iVar9,
                                      (int32_t)uVar16,(int32_t)in_R9,(int32_t)uVar16);
                      local_f8 = ((int)local_f8 < (int)uVar22) * uVar22 |
                                 ((int)local_f8 >= (int)uVar22) * local_f8;
                      uStack_f4 = ((int)uStack_f4 < (int)uVar25) * uVar25 |
                                  ((int)uStack_f4 >= (int)uVar25) * uStack_f4;
                      uStack_f0 = ((int)uStack_f0 < (int)uVar26) * uVar26 |
                                  ((int)uStack_f0 >= (int)uVar26) * uStack_f0;
                      uStack_ec = ((int)uStack_ec < (int)uVar28) * uVar28 |
                                  ((int)uStack_ec >= (int)uVar28) * uStack_ec;
                      auVar32._0_4_ = iVar39 - gap;
                      auVar32._4_4_ = iVar41 - gap;
                      auVar32._8_4_ = iVar43 - gap;
                      auVar32._12_4_ = iVar37 - gap;
                      auVar23._0_4_ = -(uint)((int)(uVar22 - open) < (int)auVar32._0_4_);
                      auVar23._4_4_ = -(uint)((int)(uVar25 - open) < (int)auVar32._4_4_);
                      auVar23._8_4_ = -(uint)((int)(uVar26 - open) < (int)auVar32._8_4_);
                      auVar23._12_4_ = -(uint)((int)(uVar28 - open) < (int)auVar32._12_4_);
                      uVar22 = movmskps(extraout_EAX,auVar23);
                      palVar11 = (__m128i *)(ulong)uVar22;
                      if (uVar22 == 0) {
                        uVar7 = 0;
                        goto LAB_00669987;
                      }
                      palVar20 = palVar20 + 1;
                    }
                  }
LAB_00669987:
                  auVar24._0_4_ = -(uint)((int)uVar31 < (int)local_f8);
                  auVar24._4_4_ = -(uint)((int)uVar34 < (int)uStack_f4);
                  auVar24._8_4_ = -(uint)((int)uVar27 < (int)uStack_f0);
                  auVar24._12_4_ = -(uint)((int)uVar29 < (int)uStack_ec);
                  iVar8 = movmskps(uVar7,auVar24);
                  palVar11 = palVar10;
                  if (iVar8 != 0) {
                    uVar31 = ((int)uStack_f0 < (int)local_f8) * local_f8 |
                             ((int)uStack_f0 >= (int)local_f8) * uStack_f0;
                    uVar34 = ((int)uStack_ec < (int)uStack_f4) * uStack_f4 |
                             ((int)uStack_ec >= (int)uStack_f4) * uStack_ec;
                    uVar31 = ((int)uVar34 < (int)uVar31) * uVar31 |
                             ((int)uVar34 >= (int)uVar31) * uVar34;
                    local_11c = uVar31;
                    if ((int)uVar13 < (int)uVar31) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      uVar16 = uVar21;
                      goto LAB_006699f6;
                    }
                    local_108 = uVar21 & 0xffffffff;
                    uVar34 = uVar31;
                    uVar27 = uVar31;
                    uVar29 = uVar31;
                  }
                  uVar21 = uVar21 + 1;
                  palVar10 = palVar18;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_striped_profile_sse41_128_32",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            vH = _mm_max_epi32(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi32(vH, vMaxH);
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}